

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O2

Error __thiscall asmjit::CodeCompiler::setArg(CodeCompiler *this,uint32_t argIndex,Reg *r)

{
  uint32_t uVar1;
  CCFunc *pCVar2;
  Error EVar3;
  ulong uVar4;
  Error EStack_10;
  
  pCVar2 = this->_func;
  if (pCVar2 == (CCFunc *)0x0) {
    EStack_10 = 4;
  }
  else {
    uVar1 = (r->super_Operand).super_Operand_.field_0._any.id;
    uVar4 = (ulong)(uVar1 - 0x100);
    if (uVar4 < (this->_vRegArray).super_ZoneVectorBase._length) {
      if (uVar1 == 0xffffffff) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/base/../base/codecompiler.h"
                   ,0x2a6,"id != kInvalidValue");
      }
      if (argIndex < (pCVar2->_funcDetail)._argCount) {
        pCVar2->_args[argIndex] =
             *(VirtReg **)((long)(this->_vRegArray).super_ZoneVectorBase._data + uVar4 * 8);
        return 0;
      }
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/base/../base/codecompiler.h"
                 ,0x144,"i < getArgCount()");
    }
    EStack_10 = 0x1a;
  }
  EVar3 = CodeEmitter::setLastError((CodeEmitter *)this,EStack_10,(char *)0x0);
  return EVar3;
}

Assistant:

Error CodeCompiler::setArg(uint32_t argIndex, const Reg& r) {
  CCFunc* func = getFunc();

  if (!func)
    return setLastError(DebugUtils::errored(kErrorInvalidState));

  if (!isVirtRegValid(r))
    return setLastError(DebugUtils::errored(kErrorInvalidVirtId));

  VirtReg* vr = getVirtReg(r);
  func->setArg(argIndex, vr);

  return kErrorOk;
}